

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::transfer_conserve_refine
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2edges,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  Alloc *pAVar2;
  OpConservation op_conservation;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  undefined4 in_stack_fffffffffffffe04;
  uint uVar7;
  undefined4 uStack_1f4;
  LOs local_1e8;
  LOs local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  LOs local_1b8;
  LOs local_1a8;
  LOs local_198;
  Cavs local_188;
  Cavs local_148;
  undefined3 uVar8;
  
  bVar3 = should_conserve_any(old_mesh,opts);
  if (bVar3) {
    local_1d8.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1d8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1d8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1d8.write_.shared_alloc_.alloc)->use_count =
             (local_1d8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1d8.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_1e8.write_.shared_alloc_.alloc = (keys2prods->write_).shared_alloc_.alloc;
    if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1e8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e8.write_.shared_alloc_.alloc)->use_count =
             (local_1e8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1e8.write_.shared_alloc_.direct_ptr = (keys2prods->write_).shared_alloc_.direct_ptr;
    local_198.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
        local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_198.write_.shared_alloc_.alloc =
             (Alloc *)((local_198.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_198.write_.shared_alloc_.alloc)->use_count =
             (local_198.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_198.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    form_initial_cavs(&local_148,old_mesh,new_mesh,1,&local_1d8,&local_1e8,&local_198);
    pAVar2 = local_198.write_.shared_alloc_.alloc;
    if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
        local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_1e8.write_.shared_alloc_.alloc;
    if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1e8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_1d8.write_.shared_alloc_.alloc;
    if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_1a8.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1a8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1a8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1a8.write_.shared_alloc_.alloc)->use_count =
             (local_1a8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1a8.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_188,1,
                      &local_1a8,(Graph *)0x0);
    pAVar2 = local_1a8.write_.shared_alloc_.alloc;
    if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1a8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    Cavs::~Cavs(&local_188);
    pAVar2 = (same_ents2old_ents->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar2 = (Alloc *)(pAVar2->size * 8 + 1);
      }
      else {
        pAVar2->use_count = pAVar2->use_count + 1;
      }
    }
    uStack_1f4 = (undefined4)((ulong)pAVar2 >> 0x20);
    uVar7 = (uint)pAVar2;
    local_1b8.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1b8.write_.shared_alloc_.alloc)->use_count =
             (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1b8.write_.shared_alloc_.direct_ptr =
         (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
    local_1c8 = 0x1010101;
    uStack_1c4 = 0x1010000;
    uStack_1c0 = 1;
    op_conservation.density.always._M_elems[1] = (bool)(char)in_stack_fffffffffffffe04;
    op_conservation.density.always._M_elems[2] = (bool)(char)((uint)in_stack_fffffffffffffe04 >> 8);
    op_conservation.momentum.this_time._M_elems[0] =
         (bool)(char)((uint)in_stack_fffffffffffffe04 >> 0x10);
    op_conservation.momentum.this_time._M_elems[1] =
         (bool)(char)((uint)in_stack_fffffffffffffe04 >> 0x18);
    op_conservation.density.this_time._M_elems[0] = true;
    op_conservation.density.this_time._M_elems[1] = false;
    op_conservation.density.this_time._M_elems[2] = false;
    op_conservation.density.always._M_elems[0] = false;
    uVar8 = (undefined3)(uVar7 >> 8);
    op_conservation.momentum.this_time._M_elems[2] = (bool)(char)uVar7;
    op_conservation.momentum.always._M_elems[0] = (bool)(char)uVar8;
    op_conservation.momentum.always._M_elems[1] = (bool)(char)((uint3)uVar8 >> 8);
    op_conservation.momentum.always._M_elems[2] = (bool)(char)((uint3)uVar8 >> 0x10);
    transfer_conservation_errors
              ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,
               (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)&stack0xfffffffffffffe08,
               &local_1b8,(LOs *)0x101000001010101,op_conservation);
    pAVar2 = local_1b8.write_.shared_alloc_.alloc;
    if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_1b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_1b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = (Alloc *)CONCAT44(uStack_1f4,uVar7);
    if ((uVar7 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
      }
    }
    puVar5 = &stack0xffffffffffffffd0;
    puVar6 = &stack0xfffffffffffffef8;
    do {
      lVar4 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar6 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0x78);
      puVar5 = puVar5 + -0x48;
      puVar6 = puVar6 + -0x48;
    } while (puVar5 != &stack0xfffffffffffffef8);
    Cavs::~Cavs(&local_148);
  }
  return;
}

Assistant:

void transfer_conserve_refine(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2edges, LOs keys2prods, LOs prods2new_ents,
    LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, EDGE, keys2edges, keys2prods, prods2new_ents);
  auto cavs =
      separate_cavities(old_mesh, new_mesh, init_cavs, EDGE, keys2edges);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = true;
  op_conservation.momentum.this_time[NOT_BDRY] = true;
  op_conservation.momentum.this_time[TOUCH_BDRY] = true;
  op_conservation.momentum.this_time[KEY_BDRY] = true;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}